

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump_kconfig.cpp
# Opt level: O2

void anon_unknown.dwarf_7b528::dump_header_class
               (MetaClass *top,ofstream *file,string *exportExpression)

{
  string *psVar1;
  ostream *poVar2;
  QDebug *pQVar3;
  pointer psVar4;
  char *pcVar5;
  shared_ptr<MetaClass> *child_1;
  char *pcVar6;
  shared_ptr<MetaClass> *child;
  pointer psVar7;
  string local_70;
  string local_50;
  
  dumpQSettingsHeader();
  if ((dumpQSettingsHeader()::category[0x10] & 1) != 0) {
    dumpQSettingsHeader();
    local_50._M_dataplus._M_p._0_4_ = 2;
    local_50._4_8_ = 0;
    local_50._12_8_ = 0;
    local_50.field_2._M_allocated_capacity._4_4_ = 0;
    local_50.field_2._8_8_ = dumpQSettingsHeader()::category._8_8_;
    QMessageLogger::debug();
    QDebug::operator<<((QDebug *)&local_70,"Dumping class header");
    QDebug::~QDebug((QDebug *)&local_70);
  }
  psVar7 = (top->subclasses).
           super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar4 = (top->subclasses).
                super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar7; psVar4 = psVar4 + 1) {
    dump_header_class((psVar4->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                      file,exportExpression);
  }
  std::operator<<((ostream *)file,"class ");
  if (exportExpression->_M_string_length != 0) {
    poVar2 = std::operator<<((ostream *)file,(string *)exportExpression);
    std::operator<<(poVar2," ");
  }
  psVar1 = &top->name;
  poVar2 = std::operator<<((ostream *)file,(string *)psVar1);
  poVar2 = std::operator<<(poVar2," : public QObject {");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)file,"\tQ_OBJECT");
  std::endl<char,std::char_traits<char>>(poVar2);
  dumpQSettingsHeader();
  if ((dumpQSettingsHeader()::category[0x10] & 1) != 0) {
    dumpQSettingsHeader();
    local_50._M_dataplus._M_p._0_4_ = 2;
    local_50._4_8_ = 0;
    local_50._12_8_ = 0;
    local_50.field_2._M_allocated_capacity._4_4_ = 0;
    local_50.field_2._8_8_ = dumpQSettingsHeader()::category._8_8_;
    QMessageLogger::debug();
    pQVar3 = QDebug::operator<<((QDebug *)&local_70,"Class has:");
    pQVar3 = QDebug::operator<<(pQVar3,(long)(top->properties).
                                             super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(top->properties).
                                             super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 4);
    QDebug::operator<<(pQVar3,"properties.");
    QDebug::~QDebug((QDebug *)&local_70);
  }
  dump_header_q_properties(file,&top->properties);
  psVar7 = (top->subclasses).
           super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar4 = (top->subclasses).
                super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar7; psVar4 = psVar4 + 1) {
    poVar2 = std::operator<<((ostream *)file,"Q_PROPERTY(QObject* ");
    camel_case_to_underscore
              (&local_50,
               &((psVar4->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->name);
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    poVar2 = std::operator<<(poVar2," MEMBER _");
    decapitalize(&local_70,
                 &((psVar4->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->name
                 ,0);
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    poVar2 = std::operator<<(poVar2," CONSTANT)");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::endl<char,std::char_traits<char>>((ostream *)file);
  poVar2 = std::operator<<((ostream *)file,"public:");
  std::endl<char,std::char_traits<char>>(poVar2);
  if ((top->parent).super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    poVar2 = std::operator<<((ostream *)file,"\tvoid sync();");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)file,"\tvoid load();");
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar6 = "* self();";
    pcVar5 = "\tstatic ";
  }
  else {
    pcVar6 = "(QObject *parent);";
    pcVar5 = "\t";
  }
  poVar2 = std::operator<<((ostream *)file,pcVar5);
  poVar2 = std::operator<<(poVar2,(string *)psVar1);
  poVar2 = std::operator<<(poVar2,pcVar6);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)file,"\t void loadDefaults();");
  std::endl<char,std::char_traits<char>>(poVar2);
  psVar7 = (top->subclasses).
           super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar4 = (top->subclasses).
                super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar7; psVar4 = psVar4 + 1) {
    poVar2 = std::operator<<((ostream *)file,"\t");
    poVar2 = std::operator<<(poVar2,(string *)
                                    &((psVar4->
                                      super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>).
                                     _M_ptr)->name);
    poVar2 = std::operator<<(poVar2," *");
    decapitalize(&local_50,
                 &((psVar4->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->name
                 ,0);
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    poVar2 = std::operator<<(poVar2,"() const;");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_50);
  }
  dump_header_properties(file,&top->properties,true);
  psVar4 = (top->subclasses).
           super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar7 = (top->subclasses).
           super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar7 != psVar4) {
    if ((top->properties).
        super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (top->properties).
        super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      poVar2 = std::endl<char,std::char_traits<char>>((ostream *)file);
      poVar2 = std::operator<<(poVar2,"private:");
      std::endl<char,std::char_traits<char>>(poVar2);
      psVar4 = (top->subclasses).
               super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar7 = (top->subclasses).
               super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; psVar4 != psVar7; psVar4 = psVar4 + 1) {
      poVar2 = std::operator<<((ostream *)file,"\t");
      poVar2 = std::operator<<(poVar2,(string *)
                                      &((psVar4->
                                        super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>).
                                       _M_ptr)->name);
      poVar2 = std::operator<<(poVar2," *_");
      decapitalize(&local_50,
                   &((psVar4->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                    name,0);
      poVar2 = std::operator<<(poVar2,(string *)&local_50);
      poVar2 = std::operator<<(poVar2,";");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  if ((top->parent).super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    if (((top->properties).
         super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (top->properties).
         super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       ((top->subclasses).
        super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (top->subclasses).
        super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      poVar2 = std::endl<char,std::char_traits<char>>((ostream *)file);
      poVar2 = std::operator<<(poVar2,"private:");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    poVar2 = std::operator<<((ostream *)file,"\t");
    poVar2 = std::operator<<(poVar2,(string *)psVar1);
    poVar2 = std::operator<<(poVar2,"();");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  poVar2 = std::operator<<((ostream *)file,"};");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void dump_header_class(
    MetaClass *top,
    std::ofstream &file,
    const std::string &exportExpression)
{

  qCDebug(dumpKConfigHeader) << "Dumping class header";
  for (auto &&child : top->subclasses) {
    dump_header_class(child.get(), file, exportExpression);
  }

  file << "class ";

  if (exportExpression.size() != 0) {
    file << exportExpression << " ";
  }

  file << top->name << " : public QObject {" << std::endl;
  file << "\tQ_OBJECT" << std::endl;

  // Q_PROPERTY declarations
  qCDebug(dumpKConfigHeader) << "Class has:" << top->properties.size()
                      << "properties.";
  dump_header_q_properties(file, top->properties);

  for (auto &&child : top->subclasses) {
    file << "Q_PROPERTY(QObject* " << camel_case_to_underscore(child->name)
         << " MEMBER _" << decapitalize(child->name, 0) << " CONSTANT)"
         << std::endl;
  }

  file << std::endl;
  file << "public:" << std::endl;
  if (top->parent) {
    file << "\t" << top->name << "(QObject *parent = 0);" << std::endl;
  } else {
    file << "\tvoid sync();" << std::endl;
    file << "\tvoid load();" << std::endl;
    file << "\tstatic " << top->name << "* self();" << std::endl;
  }

  file << "\t void loadDefaults();" << std::endl;

  for (auto &&child : top->subclasses) {
    file << "\t" << child->name << " *" << decapitalize(child->name, 0)
         << "() const;" << std::endl;
  }

  dump_header_properties(file, top->properties);
  dump_header_subclasses(file, top->subclasses, !top->properties.empty());

  if (!top->parent) {
    if (!top->properties.empty() || top->subclasses.empty()) {
      file << std::endl << "private:" << std::endl;
    }
    file << "\t" << top->name << "(QObject *parent = 0);" << std::endl;
  }
  file << "};" << std::endl << std::endl;
}